

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAdapter.cpp
# Opt level: O0

void __thiscall OpenMD::DirectionalAdapter::makeDirectional(DirectionalAdapter *this,Mat3x3d *I)

{
  bool bVar1;
  DirectionalAtypeParameters *in_RDI;
  DirectionalAtypeParameters directionalParam;
  string *in_stack_ffffffffffffff48;
  AtomType *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  shared_ptr<OpenMD::GenericData> local_78 [4];
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffffc8;
  AtomType *in_stack_ffffffffffffffd0;
  
  bVar1 = isDirectional((DirectionalAdapter *)0x25fc9e);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x25fcc7);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_stack_ffffffffffffff50,
             (SquareMatrix3<double> *)in_stack_ffffffffffffff48);
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>,std::__cxx11::string_const&,OpenMD::DirectionalAtypeParameters&>
            (in_stack_ffffffffffffff78,in_RDI);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>,void>
            (local_78,(shared_ptr<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>_> *)
                      in_stack_ffffffffffffff48);
  AtomType::addProperty(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x25fd2c);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>_> *)0x25fd36);
  DirectionalAtypeParameters::~DirectionalAtypeParameters((DirectionalAtypeParameters *)0x25fd40);
  return;
}

Assistant:

void DirectionalAdapter::makeDirectional(Mat3x3d I) {
    if (isDirectional()) { at_->removeProperty(DirectionalTypeID); }

    DirectionalAtypeParameters directionalParam {};

    directionalParam.I = I;

    at_->addProperty(std::make_shared<DirectionalAtypeData>(DirectionalTypeID,
                                                            directionalParam));
  }